

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latexOutline.cpp
# Opt level: O0

void generateOutline(vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> *outline,TSNode node,
                    File *file,bool recursive,Point endPoint)

{
  TSNode child_00;
  TSNode child_01;
  TSNode node_00;
  TSNode self;
  undefined1 auVar1 [24];
  TSNode self_00;
  TSNode self_01;
  uint32_t uVar2;
  int iVar3;
  char *pcVar4;
  TSTree *in_stack_fffffffffffffea8;
  undefined1 local_70 [8];
  TSNode child;
  uint32_t i;
  uint32_t numChildren;
  bool recursive_local;
  File *file_local;
  vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> *outline_local;
  Point endPoint_local;
  
  auVar1 = node._8_24_;
  self.tree = in_stack_fffffffffffffea8;
  self.context[0] = auVar1._0_4_;
  self.context[1] = auVar1._4_4_;
  self.context[2] = auVar1._8_4_;
  self.context[3] = auVar1._12_4_;
  self.id = (void *)auVar1._16_8_;
  uVar2 = ts_node_named_child_count(self);
  for (child.tree._4_4_ = 0; child.tree._4_4_ < uVar2; child.tree._4_4_ = child.tree._4_4_ + 1) {
    ts_node_named_child((TSNode *)local_70,node,child.tree._4_4_);
    self_00.context[2] = child.context[2];
    self_00.context[3] = child.context[3];
    self_00.context[0] = child.context[0];
    self_00.context[1] = child.context[1];
    self_00.id = child.id;
    self_00.tree = in_stack_fffffffffffffea8;
    pcVar4 = ts_node_type(self_00);
    iVar3 = strcmp(pcVar4,"control_word");
    if (iVar3 == 0) {
      child_00.context[2] = child.context[0];
      child_00.context[3] = child.context[1];
      child_00.context[0] = local_70._0_4_;
      child_00.context[1] = local_70._4_4_;
      child_00.id = (void *)child.context._8_8_;
      child_00.tree = (TSTree *)child.id;
      addControlWordOutline(outline,child_00,file,endPoint);
    }
    else {
      self_01.context[2] = child.context[2];
      self_01.context[3] = child.context[3];
      self_01.context[0] = child.context[0];
      self_01.context[1] = child.context[1];
      self_01.id = child.id;
      self_01.tree = in_stack_fffffffffffffea8;
      pcVar4 = ts_node_type(self_01);
      iVar3 = strcmp(pcVar4,"environment");
      if (iVar3 == 0) {
        child_01.context[2] = child.context[0];
        child_01.context[3] = child.context[1];
        child_01.context[0] = local_70._0_4_;
        child_01.context[1] = local_70._4_4_;
        child_01.id = (void *)child.context._8_8_;
        child_01.tree = (TSTree *)child.id;
        addEnvOutline(outline,child_01,file,recursive);
      }
      else if (recursive) {
        node_00.context[2] = child.context[0];
        node_00.context[3] = child.context[1];
        node_00.context[0] = local_70._0_4_;
        node_00.context[1] = local_70._4_4_;
        node_00.id = (void *)child.context._8_8_;
        node_00.tree = (TSTree *)child.id;
        generateOutline(outline,node_00,file,recursive,endPoint);
      }
    }
  }
  return;
}

Assistant:

void generateOutline (vector<DocumentSymbol> &outline, TSNode node, File &file, bool recursive, Point endPoint) {
    uint32_t numChildren = ts_node_named_child_count(node);
    for (uint32_t i = 0; i < numChildren; i++) {
        TSNode child = ts_node_named_child(node, i);

        if (NODE_NAME_IS(child, "control_word")) {
            addControlWordOutline(outline, child, file, endPoint);
        } else if (NODE_NAME_IS(child, "environment")) {
            addEnvOutline(outline, child, file, recursive);
        } else if (recursive) {
            generateOutline(outline, child, file, recursive, endPoint);
        }
    }
}